

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void write_buffer_4x4(__m128i *in,uint16_t *output,int stride,int fliplr,int flipud,int shift,int bd
                     )

{
  uint16_t *puVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined4 *puVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  longlong lVar12;
  long lVar13;
  int iVar14;
  ushort uVar15;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  __m128i in_XMM0;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ushort uVar25;
  __m128i in_XMM1;
  undefined1 auVar27 [16];
  __m128i in_XMM2;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  undefined1 in_XMM4 [16];
  short sVar16;
  short sVar26;
  
  if (shift != 0) {
    iVar14 = 1 << ((char)shift - 1U & 0x1f);
    lVar12 = in[2][0];
    iVar5 = *(int *)((long)in[2] + 4);
    lVar9 = in[2][1];
    iVar6 = *(int *)((long)in[2] + 0xc);
    lVar10 = in[3][0];
    iVar7 = *(int *)((long)in[3] + 4);
    lVar11 = in[3][1];
    iVar8 = *(int *)((long)in[3] + 0xc);
    in_XMM4 = ZEXT416((uint)shift);
    in_XMM1[0]._0_4_ = (int)(*in)[0] + iVar14 >> in_XMM4;
    in_XMM1[0]._4_4_ = *(int *)((long)*in + 4) + iVar14 >> in_XMM4;
    in_XMM1[1]._0_4_ = (int)(*in)[1] + iVar14 >> in_XMM4;
    in_XMM1[1]._4_4_ = *(int *)((long)*in + 0xc) + iVar14 >> in_XMM4;
    in_XMM2[0]._0_4_ = (int)in[1][0] + iVar14 >> in_XMM4;
    in_XMM2[0]._4_4_ = *(int *)((long)in[1] + 4) + iVar14 >> in_XMM4;
    in_XMM2[1]._0_4_ = (int)in[1][1] + iVar14 >> in_XMM4;
    in_XMM2[1]._4_4_ = *(int *)((long)in[1] + 0xc) + iVar14 >> in_XMM4;
    *in = in_XMM1;
    in[1] = in_XMM2;
    *(int *)in[2] = (int)lVar12 + iVar14 >> in_XMM4;
    *(int *)((long)in[2] + 4) = iVar5 + iVar14 >> in_XMM4;
    *(int *)(in[2] + 1) = (int)lVar9 + iVar14 >> in_XMM4;
    *(int *)((long)in[2] + 0xc) = iVar6 + iVar14 >> in_XMM4;
    in_XMM0[0]._0_4_ = iVar14 + (int)lVar10 >> in_XMM4;
    in_XMM0[0]._4_4_ = iVar14 + iVar7 >> in_XMM4;
    in_XMM0[1]._0_4_ = iVar14 + (int)lVar11 >> in_XMM4;
    in_XMM0[1]._4_4_ = iVar14 + iVar8 >> in_XMM4;
    in[3] = in_XMM0;
  }
  lVar13 = (long)(stride * 3);
  auVar17 = pmovzxwd((undefined1  [16])in_XMM0,*(undefined8 *)output);
  auVar28 = pmovzxwd((undefined1  [16])in_XMM2,*(undefined8 *)(output + stride));
  uVar3 = *(ulong *)(output + lVar13);
  auVar27 = pmovzxwd((undefined1  [16])in_XMM1,*(undefined8 *)(output + stride * 2));
  if (fliplr != 0) {
    lVar12 = (*in)[0];
    puVar4 = (undefined4 *)((long)*in + 4);
    uVar2 = *puVar4;
    lVar9 = (*in)[1];
    *(undefined4 *)*in = *puVar4;
    *(int *)((long)*in + 4) = (int)lVar9;
    *(undefined4 *)(*in + 1) = uVar2;
    *(int *)((long)*in + 0xc) = (int)lVar12;
    lVar12 = in[1][0];
    puVar4 = (undefined4 *)((long)in[1] + 4);
    uVar2 = *puVar4;
    lVar9 = in[1][1];
    *(undefined4 *)in[1] = *puVar4;
    *(int *)((long)in[1] + 4) = (int)lVar9;
    *(undefined4 *)(in[1] + 1) = uVar2;
    *(int *)((long)in[1] + 0xc) = (int)lVar12;
    lVar12 = in[2][0];
    puVar4 = (undefined4 *)((long)in[2] + 4);
    uVar2 = *puVar4;
    lVar9 = in[2][1];
    *(undefined4 *)in[2] = *puVar4;
    *(int *)((long)in[2] + 4) = (int)lVar9;
    *(undefined4 *)(in[2] + 1) = uVar2;
    *(int *)((long)in[2] + 0xc) = (int)lVar12;
    lVar12 = in[3][0];
    puVar4 = (undefined4 *)((long)in[3] + 4);
    uVar2 = *puVar4;
    lVar9 = in[3][1];
    *(undefined4 *)in[3] = *puVar4;
    *(int *)((long)in[3] + 4) = (int)lVar9;
    *(undefined4 *)(in[3] + 1) = uVar2;
    *(int *)((long)in[3] + 0xc) = (int)lVar12;
  }
  if (flipud == 0) {
    auVar18._0_4_ = auVar17._0_4_ + (int)(*in)[0];
    auVar18._4_4_ = auVar17._4_4_ + *(int *)((long)*in + 4);
    auVar18._8_4_ = auVar17._8_4_ + (int)(*in)[1];
    auVar18._12_4_ = auVar17._12_4_ + *(int *)((long)*in + 0xc);
    auVar29._0_4_ = auVar28._0_4_ + (int)in[1][0];
    auVar29._4_4_ = auVar28._4_4_ + *(int *)((long)in[1] + 4);
    auVar29._8_4_ = auVar28._8_4_ + (int)in[1][1];
    auVar29._12_4_ = auVar28._12_4_ + *(int *)((long)in[1] + 0xc);
    auVar17._0_4_ = auVar27._0_4_ + (int)in[2][0];
    auVar17._4_4_ = auVar27._4_4_ + *(int *)((long)in[2] + 4);
    auVar17._8_4_ = auVar27._8_4_ + (int)in[2][1];
    auVar17._12_4_ = auVar27._12_4_ + *(int *)((long)in[2] + 0xc);
    in = in + 3;
  }
  else {
    auVar18._0_4_ = auVar17._0_4_ + (int)in[3][0];
    auVar18._4_4_ = auVar17._4_4_ + *(int *)((long)in[3] + 4);
    auVar18._8_4_ = auVar17._8_4_ + (int)in[3][1];
    auVar18._12_4_ = auVar17._12_4_ + *(int *)((long)in[3] + 0xc);
    auVar29._0_4_ = auVar28._0_4_ + (int)in[2][0];
    auVar29._4_4_ = auVar28._4_4_ + *(int *)((long)in[2] + 4);
    auVar29._8_4_ = auVar28._8_4_ + (int)in[2][1];
    auVar29._12_4_ = auVar28._12_4_ + *(int *)((long)in[2] + 0xc);
    auVar17._0_4_ = auVar27._0_4_ + (int)in[1][0];
    auVar17._4_4_ = auVar27._4_4_ + *(int *)((long)in[1] + 4);
    auVar17._8_4_ = auVar27._8_4_ + (int)in[1][1];
    auVar17._12_4_ = auVar27._12_4_ + *(int *)((long)in[1] + 0xc);
  }
  auVar27 = packusdw(auVar18,auVar29);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar3;
  auVar28 = pmovzxwd(auVar28,auVar28);
  auVar30._0_4_ = auVar28._0_4_ + (int)(*in)[0];
  auVar30._4_4_ = auVar28._4_4_ + *(int *)((long)*in + 4);
  auVar30._8_4_ = auVar28._8_4_ + (int)(*in)[1];
  auVar30._12_4_ = auVar28._12_4_ + *(int *)((long)*in + 0xc);
  auVar28 = pmovsxbw(in_XMM4,0x101010101010101);
  auVar28 = psllw(auVar28,ZEXT416((uint)bd));
  sVar31 = auVar28._0_2_ + -1;
  sVar32 = auVar28._2_2_ + -1;
  sVar33 = auVar28._4_2_ + -1;
  sVar34 = auVar28._6_2_ + -1;
  sVar35 = auVar28._8_2_ + -1;
  sVar36 = auVar28._10_2_ + -1;
  sVar37 = auVar28._12_2_ + -1;
  sVar38 = auVar28._14_2_ + -1;
  sVar16 = auVar27._0_2_;
  uVar15 = (ushort)(sVar31 < sVar16) * sVar31 | (ushort)(sVar31 >= sVar16) * sVar16;
  sVar16 = auVar27._2_2_;
  uVar19 = (ushort)(sVar32 < sVar16) * sVar32 | (ushort)(sVar32 >= sVar16) * sVar16;
  sVar16 = auVar27._4_2_;
  uVar20 = (ushort)(sVar33 < sVar16) * sVar33 | (ushort)(sVar33 >= sVar16) * sVar16;
  sVar16 = auVar27._6_2_;
  uVar21 = (ushort)(sVar34 < sVar16) * sVar34 | (ushort)(sVar34 >= sVar16) * sVar16;
  sVar16 = auVar27._8_2_;
  uVar22 = (ushort)(sVar35 < sVar16) * sVar35 | (ushort)(sVar35 >= sVar16) * sVar16;
  sVar16 = auVar27._10_2_;
  uVar23 = (ushort)(sVar36 < sVar16) * sVar36 | (ushort)(sVar36 >= sVar16) * sVar16;
  sVar16 = auVar27._12_2_;
  sVar26 = auVar27._14_2_;
  uVar24 = (ushort)(sVar37 < sVar16) * sVar37 | (ushort)(sVar37 >= sVar16) * sVar16;
  uVar25 = (ushort)(sVar38 < sVar26) * sVar38 | (ushort)(sVar38 >= sVar26) * sVar26;
  *output = (-1 < (short)uVar15) * uVar15;
  output[1] = (-1 < (short)uVar19) * uVar19;
  output[2] = (-1 < (short)uVar20) * uVar20;
  output[3] = (-1 < (short)uVar21) * uVar21;
  output[(long)stride + 4] = (-1 < (short)uVar22) * uVar22;
  output[(long)stride + 5] = (-1 < (short)uVar23) * uVar23;
  output[(long)stride + 6] = (-1 < (short)uVar24) * uVar24;
  output[(long)stride + 7] = (-1 < (short)uVar25) * uVar25;
  auVar17 = packusdw(auVar17,auVar30);
  sVar16 = auVar17._0_2_;
  uVar15 = (ushort)(sVar16 < sVar31) * sVar16 | (ushort)(sVar16 >= sVar31) * sVar31;
  sVar16 = auVar17._2_2_;
  uVar19 = (ushort)(sVar16 < sVar32) * sVar16 | (ushort)(sVar16 >= sVar32) * sVar32;
  sVar16 = auVar17._4_2_;
  uVar20 = (ushort)(sVar16 < sVar33) * sVar16 | (ushort)(sVar16 >= sVar33) * sVar33;
  sVar16 = auVar17._6_2_;
  uVar21 = (ushort)(sVar16 < sVar34) * sVar16 | (ushort)(sVar16 >= sVar34) * sVar34;
  sVar16 = auVar17._8_2_;
  uVar22 = (ushort)(sVar16 < sVar35) * sVar16 | (ushort)(sVar16 >= sVar35) * sVar35;
  sVar16 = auVar17._10_2_;
  uVar23 = (ushort)(sVar16 < sVar36) * sVar16 | (ushort)(sVar16 >= sVar36) * sVar36;
  sVar16 = auVar17._12_2_;
  uVar24 = (ushort)(sVar16 < sVar37) * sVar16 | (ushort)(sVar16 >= sVar37) * sVar37;
  sVar16 = auVar17._14_2_;
  uVar25 = (ushort)(sVar16 < sVar38) * sVar16 | (ushort)(sVar16 >= sVar38) * sVar38;
  puVar1 = output + stride * 2;
  *puVar1 = (-1 < (short)uVar15) * uVar15;
  puVar1[1] = (-1 < (short)uVar19) * uVar19;
  puVar1[2] = (-1 < (short)uVar20) * uVar20;
  puVar1[3] = (-1 < (short)uVar21) * uVar21;
  output[lVar13 + 4] = (-1 < (short)uVar22) * uVar22;
  output[lVar13 + 5] = (-1 < (short)uVar23) * uVar23;
  output[lVar13 + 6] = (-1 < (short)uVar24) * uVar24;
  output[lVar13 + 7] = (-1 < (short)uVar25) * uVar25;
  return;
}

Assistant:

static void write_buffer_4x4(__m128i *in, uint16_t *output, int stride,
                             int fliplr, int flipud, int shift, int bd) {
  const __m128i zero = _mm_setzero_si128();
  __m128i u0, u1, u2, u3;
  __m128i v0, v1, v2, v3;

  round_shift_4x4(in, shift);

  v0 = _mm_loadl_epi64((__m128i const *)(output + 0 * stride));
  v1 = _mm_loadl_epi64((__m128i const *)(output + 1 * stride));
  v2 = _mm_loadl_epi64((__m128i const *)(output + 2 * stride));
  v3 = _mm_loadl_epi64((__m128i const *)(output + 3 * stride));

  v0 = _mm_unpacklo_epi16(v0, zero);
  v1 = _mm_unpacklo_epi16(v1, zero);
  v2 = _mm_unpacklo_epi16(v2, zero);
  v3 = _mm_unpacklo_epi16(v3, zero);

  if (fliplr) {
    in[0] = _mm_shuffle_epi32(in[0], 0x1B);
    in[1] = _mm_shuffle_epi32(in[1], 0x1B);
    in[2] = _mm_shuffle_epi32(in[2], 0x1B);
    in[3] = _mm_shuffle_epi32(in[3], 0x1B);
  }

  if (flipud) {
    u0 = _mm_add_epi32(in[3], v0);
    u1 = _mm_add_epi32(in[2], v1);
    u2 = _mm_add_epi32(in[1], v2);
    u3 = _mm_add_epi32(in[0], v3);
  } else {
    u0 = _mm_add_epi32(in[0], v0);
    u1 = _mm_add_epi32(in[1], v1);
    u2 = _mm_add_epi32(in[2], v2);
    u3 = _mm_add_epi32(in[3], v3);
  }

  v0 = _mm_packus_epi32(u0, u1);
  v2 = _mm_packus_epi32(u2, u3);

  u0 = highbd_clamp_epi16(v0, bd);
  u2 = highbd_clamp_epi16(v2, bd);

  v0 = _mm_unpacklo_epi64(u0, u0);
  v1 = _mm_unpackhi_epi64(u0, u0);
  v2 = _mm_unpacklo_epi64(u2, u2);
  v3 = _mm_unpackhi_epi64(u2, u2);

  _mm_storel_epi64((__m128i *)(output + 0 * stride), v0);
  _mm_storel_epi64((__m128i *)(output + 1 * stride), v1);
  _mm_storel_epi64((__m128i *)(output + 2 * stride), v2);
  _mm_storel_epi64((__m128i *)(output + 3 * stride), v3);
}